

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  char *__n;
  impl_string_type *piVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  path *element;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  format fVar8;
  ulong uVar10;
  const_iterator cVar11;
  path *result;
  iterator __begin2;
  iterator __end2;
  const_iterator a;
  const_iterator b;
  const_iterator local_250;
  long local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  impl_string_type *local_230;
  undefined1 local_228 [32];
  _Alloc_hider local_208;
  size_t local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  path *local_1e0;
  impl_string_type local_1d8;
  undefined1 local_1b8 [32];
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  _Alloc_hider local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  const_iterator local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  long *local_118 [2];
  long local_108 [3];
  impl_string_type local_f0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  size_t local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  impl_string_type local_90;
  iterator local_70;
  pointer pcVar9;
  
  local_230 = &__return_storage_ptr__->_path;
  local_1e0 = this;
  root_name((path *)local_1b8,this);
  root_name((path *)local_d0,base);
  __n = (char *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
  if ((__n == (char *)local_d0._8_8_) &&
     ((__n == (char *)0x0 ||
      (iVar4 = bcmp((void *)local_1b8._0_8_,(void *)local_d0._0_8_,(size_t)__n), iVar4 == 0)))) {
    bVar2 = has_root_directory(local_1e0);
    bVar3 = has_root_directory(base);
    if (bVar2 == bVar3) {
      bVar2 = has_root_directory(local_1e0);
      if (bVar2) {
        if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
          operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
        }
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
        }
LAB_00154238:
        local_228._0_8_ = (local_1e0->_path)._M_dataplus._M_p;
        local_70._first._M_current = (char *)(local_228._0_8_ + (local_1e0->_path)._M_string_length)
        ;
        local_1b8._0_8_ = local_228._0_8_;
        iterator::iterator((iterator *)local_d0,(const_iterator *)local_1b8,&local_70._first,
                           (const_iterator *)local_228);
        local_1b8._0_8_ = (base->_path)._M_dataplus._M_p;
        local_228._0_8_ = local_1b8._0_8_ + (base->_path)._M_string_length;
        local_138._M_current = (char *)local_1b8._0_8_;
        iterator::iterator(&local_70,(const_iterator *)local_1b8,(const_iterator *)local_228,
                           &local_138);
        while( true ) {
          local_228._0_8_ = (local_1e0->_path)._M_dataplus._M_p;
          local_250._M_current = (char *)(local_228._0_8_ + (local_1e0->_path)._M_string_length);
          local_138._M_current = local_250._M_current;
          iterator::iterator((iterator *)local_1b8,(const_iterator *)local_228,&local_138,&local_250
                            );
          if (local_d0._24_8_ == CONCAT44(local_1b8._28_4_,local_1b8._24_4_)) {
            bVar2 = false;
          }
          else {
            local_138._M_current = (base->_path)._M_dataplus._M_p;
            local_250._M_current = local_138._M_current + (base->_path)._M_string_length;
            local_1d8._M_dataplus._M_p = local_250._M_current;
            iterator::iterator((iterator *)local_228,&local_138,&local_250,
                               (const_iterator *)&local_1d8);
            if ((local_70._iter._M_current == (char *)CONCAT44(local_228._28_4_,local_228._24_4_))
               || (local_a8 != local_70._current._path._M_string_length)) {
              bVar2 = false;
            }
            else if (local_a8 == 0) {
              bVar2 = true;
            }
            else {
              iVar4 = bcmp(local_b0._M_p,local_70._current._path._M_dataplus._M_p,local_a8);
              bVar2 = iVar4 == 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_p != &local_1f8) {
              operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != &local_188) {
            operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
          }
          if (!bVar2) break;
          iterator::operator++((iterator *)local_d0);
          iterator::operator++(&local_70);
        }
        local_228._0_8_ = (local_1e0->_path)._M_dataplus._M_p;
        local_250._M_current = (char *)(local_228._0_8_ + (local_1e0->_path)._M_string_length);
        local_138._M_current = local_250._M_current;
        iterator::iterator((iterator *)local_1b8,(const_iterator *)local_228,&local_138,&local_250);
        if (local_d0._24_8_ == CONCAT44(local_1b8._28_4_,local_1b8._24_4_)) {
          local_138._M_current = (base->_path)._M_dataplus._M_p;
          local_250._M_current = local_138._M_current + (base->_path)._M_string_length;
          local_1d8._M_dataplus._M_p = local_250._M_current;
          iterator::iterator((iterator *)local_228,&local_138,&local_250,
                             (const_iterator *)&local_1d8);
          bVar2 = local_70._iter._M_current == (char *)CONCAT44(local_228._28_4_,local_228._24_4_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_p != &local_1f8) {
            operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
          }
        }
        else {
          bVar2 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_p != &local_188) {
          operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,".","");
          piVar1 = local_230;
          (local_230->_M_dataplus)._M_p = (pointer)&local_230->field_2;
          pcVar9 = (pointer)local_1b8._0_8_;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)local_230,local_1b8._0_8_,
                     (pointer)(local_1b8._0_8_ + CONCAT44(local_1b8._12_4_,local_1b8._8_4_)));
          fVar8 = (format)pcVar9;
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            uVar10 = CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1;
            operator_delete((void *)local_1b8._0_8_,uVar10);
            fVar8 = (format)uVar10;
          }
          postprocess_path_with_format(piVar1,fVar8);
        }
        else {
          local_138._M_current = (base->_path)._M_dataplus._M_p;
          local_250._M_current = local_138._M_current + (base->_path)._M_string_length;
          local_1d8._M_dataplus._M_p = local_250._M_current;
          iterator::iterator((iterator *)local_228,&local_138,&local_250,
                             (const_iterator *)&local_1d8);
          input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                    ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1b8,&local_70,
                     (iterator *)local_228);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_p != &local_1f8) {
            operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
          }
          local_228._16_4_ = local_1b8._16_4_;
          local_228._20_4_ = local_1b8._20_4_;
          local_228._24_4_ = local_1b8._24_4_;
          local_228._28_4_ = local_1b8._28_4_;
          local_228._0_8_ = local_1b8._0_8_;
          local_228._8_4_ = local_1b8._8_4_;
          local_228._12_4_ = local_1b8._12_4_;
          local_208._M_p = (pointer)&local_1f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,local_198._M_p,local_198._M_p + local_190);
          local_128 = local_168;
          uStack_124 = uStack_164;
          uStack_120 = uStack_160;
          uStack_11c = uStack_15c;
          local_138._M_current._4_4_ = uStack_174;
          local_138._M_current._0_4_ = local_178;
          uStack_130 = uStack_170;
          uStack_12c = uStack_16c;
          local_118[0] = local_108;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_118,local_158._M_p,local_158._M_p + local_150);
          iVar4 = 0;
          while (CONCAT44(local_228._28_4_,local_228._24_4_) != CONCAT44(uStack_11c,uStack_120)) {
            local_250._M_current = (char *)&local_240;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,".","");
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            cVar11._M_current = local_250._M_current;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1d8,local_250._M_current,local_250._M_current + local_248);
            fVar8 = (format)cVar11._M_current;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_current != &local_240) {
              uVar10 = local_240._M_allocated_capacity + 1;
              operator_delete(local_250._M_current,uVar10);
              fVar8 = (format)uVar10;
            }
            postprocess_path_with_format(&local_1d8,fVar8);
            _Var7._M_p = local_1d8._M_dataplus._M_p;
            if ((local_200 == local_1d8._M_string_length) &&
               ((local_200 == 0 ||
                (iVar5 = bcmp(local_208._M_p,local_1d8._M_dataplus._M_p,local_200), iVar5 == 0)))) {
              bVar2 = false;
            }
            else {
              local_250._M_current = (char *)&local_240;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              cVar11._M_current = local_250._M_current;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_f0,local_250._M_current,local_250._M_current + local_248);
              fVar8 = (format)cVar11._M_current;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_current != &local_240) {
                uVar10 = local_240._M_allocated_capacity + 1;
                operator_delete(local_250._M_current,uVar10);
                fVar8 = (format)uVar10;
              }
              postprocess_path_with_format(&local_f0,fVar8);
              _Var6._M_p = local_f0._M_dataplus._M_p;
              if ((local_200 == local_f0._M_string_length) &&
                 ((local_200 == 0 ||
                  (iVar5 = bcmp(local_208._M_p,local_f0._M_dataplus._M_p,local_200), iVar5 == 0))))
              {
                bVar2 = false;
              }
              else {
                local_250._M_current = (char *)&local_240;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"..","");
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                cVar11._M_current = local_250._M_current;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((string *)&local_90,local_250._M_current,local_250._M_current + local_248
                          );
                fVar8 = (format)cVar11._M_current;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_current != &local_240) {
                  uVar10 = local_240._M_allocated_capacity + 1;
                  operator_delete(local_250._M_current,uVar10);
                  fVar8 = (format)uVar10;
                }
                postprocess_path_with_format(&local_90,fVar8);
                _Var7._M_p = local_90._M_dataplus._M_p;
                if (local_200 == local_90._M_string_length) {
                  if (local_200 == 0) {
                    bVar2 = false;
                  }
                  else {
                    iVar5 = bcmp(local_208._M_p,local_90._M_dataplus._M_p,local_200);
                    bVar2 = iVar5 != 0;
                  }
                }
                else {
                  bVar2 = true;
                }
                _Var6._M_p = local_f0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var7._M_p != &local_90.field_2) {
                  operator_delete(_Var7._M_p,local_90.field_2._M_allocated_capacity + 1);
                  _Var6._M_p = local_f0._M_dataplus._M_p;
                }
              }
              _Var7._M_p = local_1d8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var6._M_p != &local_f0.field_2) {
                operator_delete(_Var6._M_p,local_f0.field_2._M_allocated_capacity + 1);
                _Var7._M_p = local_1d8._M_dataplus._M_p;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var7._M_p != &local_1d8.field_2) {
              operator_delete(_Var7._M_p,local_1d8.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              iVar4 = iVar4 + 1;
            }
            else {
              local_250._M_current = (char *)&local_240;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"..","");
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              cVar11._M_current = local_250._M_current;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&local_1d8,local_250._M_current,local_250._M_current + local_248)
              ;
              fVar8 = (format)cVar11._M_current;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_current != &local_240) {
                uVar10 = local_240._M_allocated_capacity + 1;
                operator_delete(local_250._M_current,uVar10);
                fVar8 = (format)uVar10;
              }
              postprocess_path_with_format(&local_1d8,fVar8);
              _Var7._M_p = local_1d8._M_dataplus._M_p;
              if (local_200 == local_1d8._M_string_length) {
                if (local_200 == 0) {
                  iVar5 = -1;
                }
                else {
                  iVar5 = bcmp(local_208._M_p,local_1d8._M_dataplus._M_p,local_200);
                  iVar5 = -(uint)(iVar5 == 0);
                }
              }
              else {
                iVar5 = 0;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var7._M_p != &local_1d8.field_2) {
                operator_delete(_Var7._M_p,local_1d8.field_2._M_allocated_capacity + 1);
              }
              iVar4 = iVar4 + iVar5;
            }
            iterator::operator++((iterator *)local_228);
          }
          if (local_118[0] != local_108) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
          piVar1 = local_230;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_p != &local_1f8) {
            operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_p != &local_148) {
            operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_p != &local_188) {
            operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
          }
          (((impl_string_type *)&piVar1->_M_dataplus)->_M_dataplus)._M_p = (pointer)&piVar1->field_2
          ;
          piVar1->_M_string_length = 0;
          (piVar1->field_2)._M_local_buf[0] = '\0';
          if (-1 < iVar4) {
            for (; iVar4 != 0; iVar4 = iVar4 + -1) {
              append<char[3]>((path *)local_230,(char (*) [3])"..");
            }
            local_138._M_current = (local_1e0->_path)._M_dataplus._M_p;
            local_250._M_current = local_138._M_current + (local_1e0->_path)._M_string_length;
            local_1d8._M_dataplus._M_p = local_250._M_current;
            iterator::iterator((iterator *)local_228,&local_138,&local_250,
                               (const_iterator *)&local_1d8);
            input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                      ((input_iterator_range<ghc::filesystem::path::iterator> *)local_1b8,
                       (iterator *)local_d0,(iterator *)local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_p != &local_1f8) {
              operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
            }
            local_228._16_4_ = local_1b8._16_4_;
            local_228._20_4_ = local_1b8._20_4_;
            local_228._24_4_ = local_1b8._24_4_;
            local_228._28_4_ = local_1b8._28_4_;
            local_228._0_8_ = local_1b8._0_8_;
            local_228._8_4_ = local_1b8._8_4_;
            local_228._12_4_ = local_1b8._12_4_;
            local_208._M_p = (pointer)&local_1f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,local_198._M_p,local_198._M_p + local_190);
            local_128 = local_168;
            uStack_124 = uStack_164;
            uStack_120 = uStack_160;
            uStack_11c = uStack_15c;
            local_138._M_current._4_4_ = uStack_174;
            local_138._M_current._0_4_ = local_178;
            uStack_130 = uStack_170;
            uStack_12c = uStack_16c;
            local_118[0] = local_108;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_118,local_158._M_p,local_158._M_p + local_150);
            while (CONCAT44(local_228._28_4_,local_228._24_4_) != CONCAT44(uStack_11c,uStack_120)) {
              operator/=((path *)local_230,(path *)&local_208);
              iterator::operator++((iterator *)local_228);
            }
            if (local_118[0] != local_108) {
              operator_delete(local_118[0],local_108[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_p != &local_1f8) {
              operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_p != &local_148) {
              operator_delete(local_158._M_p,local_148._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_p != &local_188) {
              operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
          operator_delete(local_70._current._path._M_dataplus._M_p,
                          local_70._current._path.field_2._M_allocated_capacity + 1);
        }
        piVar1 = local_230;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p == &local_a0) {
          return (path *)local_230;
        }
        operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
        return (path *)piVar1;
      }
      bVar2 = has_root_directory(base);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
      }
      if (!bVar2) goto LAB_00154238;
      goto LAB_00154165;
    }
  }
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,CONCAT44(local_1b8._20_4_,local_1b8._16_4_) + 1);
  }
LAB_00154165:
  (((impl_string_type *)&local_230->_M_dataplus)->_M_dataplus)._M_p = (pointer)&local_230->field_2;
  local_230->_M_string_length = 0;
  (local_230->field_2)._M_local_buf[0] = '\0';
  return (path *)local_230;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}